

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void MatchFinder_ReadBlock(CMatchFinder *p)

{
  undefined4 uVar1;
  long *in_RDI;
  size_t size;
  Byte *dest;
  UInt32 curSize;
  long local_20;
  long local_18;
  uint local_c;
  long *local_8;
  
  if (((char)in_RDI[4] == '\0') && (*(int *)((long)in_RDI + 0x74) == 0)) {
    local_8 = in_RDI;
    if (*(char *)((long)in_RDI + 0x23) == '\0') {
      do {
        local_18 = *local_8 + (ulong)(uint)((int)local_8[2] - (int)local_8[1]);
        local_20 = (local_8[8] + (ulong)*(uint *)(local_8 + 10)) - local_18;
        if (local_20 == 0) {
          return;
        }
        uVar1 = (**(code **)local_8[9])(local_8[9],local_18,&local_20);
        *(undefined4 *)((long)local_8 + 0x74) = uVar1;
        if (*(int *)((long)local_8 + 0x74) != 0) {
          return;
        }
        if (local_20 == 0) {
          *(undefined1 *)(local_8 + 4) = 1;
          return;
        }
        *(int *)(local_8 + 2) = (int)local_20 + (int)local_8[2];
      } while ((uint)((int)local_8[2] - (int)local_8[1]) <= *(uint *)(local_8 + 0xb));
    }
    else {
      local_c = -((int)in_RDI[2] - (int)in_RDI[1]) - 1;
      if ((ulong)in_RDI[0xc] < (ulong)local_c) {
        local_c = (uint)in_RDI[0xc];
      }
      in_RDI[0xc] = in_RDI[0xc] - (ulong)local_c;
      *(uint *)(in_RDI + 2) = local_c + (int)in_RDI[2];
      if (in_RDI[0xc] == 0) {
        *(undefined1 *)(in_RDI + 4) = 1;
      }
    }
  }
  return;
}

Assistant:

static void MatchFinder_ReadBlock(CMatchFinder *p)
{
  if (p->streamEndWasReached || p->result != SZ_OK)
    return;

  /* We use (p->streamPos - p->pos) value. (p->streamPos < p->pos) is allowed. */

  if (p->directInput)
  {
    UInt32 curSize = 0xFFFFFFFF - (p->streamPos - p->pos);
    if (curSize > p->directInputRem)
      curSize = (UInt32)p->directInputRem;
    p->directInputRem -= curSize;
    p->streamPos += curSize;
    if (p->directInputRem == 0)
      p->streamEndWasReached = 1;
    return;
  }
  
  for (;;)
  {
    Byte *dest = p->buffer + (p->streamPos - p->pos);
    size_t size = (p->bufferBase + p->blockSize - dest);
    if (size == 0)
      return;

    p->result = p->stream->Read(p->stream, dest, &size);
    if (p->result != SZ_OK)
      return;
    if (size == 0)
    {
      p->streamEndWasReached = 1;
      return;
    }
    p->streamPos += (UInt32)size;
    if (p->streamPos - p->pos > p->keepSizeAfter)
      return;
  }
}